

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MethodBuilder.cpp
# Opt level: O2

uint8_t * __thiscall
Lodtalk::MethodAssembler::ConditionalJump::encode(ConditionalJump *this,uint8_t *buffer)

{
  ulong uVar1;
  
  uVar1 = (this->destination->super_InstructionNode).position -
          ((this->super_InstructionNode).size + (this->super_InstructionNode).position);
  if (uVar1 != 0) {
    if (uVar1 < 9) {
      *buffer = (this->condition ^ 1U) * '\b' + (uint8_t)uVar1 + 0xb7;
      buffer = buffer + 1;
    }
    else {
      InstructionNode::encodeExtB(&this->super_InstructionNode,buffer,(long)uVar1 / 0x100);
      *buffer = this->condition ^ 0xef;
      buffer[1] = (uint8_t)uVar1;
      buffer = buffer + 2;
    }
  }
  return buffer;
}

Assistant:

virtual uint8_t *encode(uint8_t *buffer)
	{
        auto delta = jumpDeltaValue();
        if(delta == 0)
            return buffer;

        if(1 <= delta && delta <= 8)
        {
            if(condition)
                *buffer++ = uint8_t(BytecodeSet::JumpOnTrueShortFirst + delta - 1);
            else
                *buffer++ = uint8_t(BytecodeSet::JumpOnFalseShortFirst + delta - 1);
            return buffer;
        }

        buffer = encodeExtB(buffer, delta / 256);
        *buffer++ = condition ? BytecodeSet::JumpOnTrue : BytecodeSet::JumpOnFalse;
        *buffer++ = delta % 256;
		return buffer;
	}